

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CartesianProduct.cpp
# Opt level: O0

void __thiscall
mnf::CartesianProduct::getIdentityOnTxM_(CartesianProduct *this,RefMat *out,ConstRefVec *x)

{
  ulong uVar1;
  int iVar2;
  undefined4 extraout_var;
  __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_1e8;
  Type local_1c0;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_188;
  Type local_160;
  ulong local_128;
  size_t j;
  DenseBase<Eigen::Block<const_Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,__1,_1,_false>_>
  local_110 [56];
  ConstRefVec local_d8;
  Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_> local_b0;
  DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>
  local_88 [56];
  Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>> local_50 [40];
  ulong local_28;
  size_t i;
  ConstRefVec *x_local;
  RefMat *out_local;
  CartesianProduct *this_local;
  
  local_28 = 0;
  i = (size_t)x;
  x_local = (ConstRefVec *)out;
  out_local = (RefMat *)this;
  while( true ) {
    uVar1 = local_28;
    iVar2 = (*(this->super_Manifold)._vptr_Manifold[7])();
    if (CONCAT44(extraout_var,iVar2) <= uVar1) break;
    this_00 = (__shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              std::
              vector<std::shared_ptr<const_mnf::Manifold>,_std::allocator<std::shared_ptr<const_mnf::Manifold>_>_>
              ::operator[](&this->subManifolds_,local_28);
    this_01 = std::
              __shared_ptr_access<const_mnf::Manifold,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Ref
              (&local_b0,out);
    Manifold::getView<1,1>((Type *)local_88,&this->super_Manifold,&local_b0,local_28);
    Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
              (local_50,local_88,(type *)0x0);
    Manifold::getConstView<0>
              ((ConstSegment *)local_110,&this->super_Manifold,(ConstRefVec *)i,local_28);
    Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
    Ref<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>const,_1,1,false>>
              ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_d8,
               local_110,(type *)0x0);
    Manifold::getIdentityOnTxM(this_01,(RefMat *)local_50,&local_d8);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_d8);
    for (local_128 = 0; local_128 < local_28; local_128 = local_128 + 1) {
      Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Ref
                (&local_188,out);
      Manifold::getView<1,1>(&local_160,&this->super_Manifold,&local_188,local_28,local_128);
      Eigen::
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>
                 *)&local_160);
      Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>::Ref
                (&local_1e8,out);
      Manifold::getView<1,1>(&local_1c0,&this->super_Manifold,&local_1e8,local_128,local_28);
      Eigen::
      DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_-1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>_>
                 *)&local_1c0);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void CartesianProduct::getIdentityOnTxM_(RefMat out, const ConstRefVec& x) const
{
  for (std::size_t i = 0; i < numberOfSubManifolds(); ++i)
  {
    subManifolds_[i]->getIdentityOnTxM(getView<T, T>(out, i),
                                       getConstView<R>(x, i));
    for (std::size_t j = 0; j < i; ++j)
    {
      getView<T, T>(out, i, j).setZero();
      getView<T, T>(out, j, i).setZero();
    }
  }
}